

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

int __thiscall Catch::Session::runInternal(Session *this)

{
  bool bVar1;
  uint uVar2;
  Config *pCVar3;
  IMutableContext *pIVar4;
  IStreamingReporter *reporter_00;
  int *piVar5;
  exception *ex;
  undefined1 local_2b0 [8];
  Totals totals;
  TestGroup tests;
  unique_ptr<Catch::IStreamingReporter> local_30;
  IStreamingReporterPtr reporter;
  Session *this_local;
  
  if ((this->m_startupExceptions & 1U) == 0) {
    if ((((this->m_configData).showHelp & 1U) == 0) &&
       (((this->m_configData).libIdentify & 1U) == 0)) {
      config(this);
      pCVar3 = Detail::unique_ptr<Catch::Config>::operator*(&this->m_config);
      seedRng(&pCVar3->super_IConfig);
      if (((this->m_configData).filenamesAsTags & 1U) != 0) {
        anon_unknown_23::applyFilenamesAsTags();
      }
      pIVar4 = getCurrentMutableContext();
      pCVar3 = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
      (*(pIVar4->super_IContext)._vptr_IContext[7])(pIVar4,pCVar3);
      pCVar3 = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
      anon_unknown_23::makeReporter((anon_unknown_23 *)&local_30,pCVar3);
      reporter_00 = Detail::unique_ptr<Catch::IStreamingReporter>::operator*(&local_30);
      pCVar3 = Detail::unique_ptr<Catch::Config>::operator*(&this->m_config);
      bVar1 = list(reporter_00,pCVar3);
      if (bVar1) {
        this_local._4_4_ = 0;
      }
      else {
        pCVar3 = Detail::unique_ptr<Catch::Config>::get(&this->m_config);
        anon_unknown_23::TestGroup::TestGroup
                  ((TestGroup *)&totals.testCases.failedButOk,&local_30,pCVar3);
        anon_unknown_23::TestGroup::execute
                  ((Totals *)local_2b0,(TestGroup *)&totals.testCases.failedButOk);
        pCVar3 = Detail::unique_ptr<Catch::Config>::operator->(&this->m_config);
        uVar2 = (*(pCVar3->super_IConfig)._vptr_IConfig[8])();
        if (((uVar2 & 1) == 0) || (local_2b0._0_4_ != -1)) {
          ex._4_4_ = (undefined4)totals.assertions.passed;
          piVar5 = std::max<int>((int *)local_2b0,(int *)((long)&ex + 4));
          piVar5 = std::min<int>(&(anonymous_namespace)::MaxExitCode,piVar5);
          this_local._4_4_ = *piVar5;
        }
        else {
          this_local._4_4_ = 2;
        }
        anon_unknown_23::TestGroup::~TestGroup((TestGroup *)&totals.testCases.failedButOk);
      }
      Detail::unique_ptr<Catch::IStreamingReporter>::~unique_ptr(&local_30);
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  else {
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int Session::runInternal() {
        if (m_startupExceptions)
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY{
            config(); // Force config to be constructed

            seedRng(*m_config);

            if (m_configData.filenamesAsTags) {
                applyFilenamesAsTags();
            }

            // Set up global config instance before we start calling into other functions
            getCurrentMutableContext().setConfig(m_config.get());

            // Create reporter(s) so we can route listings through them
            auto reporter = makeReporter(m_config.get());

            // Handle list request
            if (list(*reporter, *m_config)) {
                return 0;
            }

            TestGroup tests { std::move(reporter), m_config.get() };
            auto const totals = tests.execute();

            if (m_config->warnAboutNoTests() && totals.error == -1)
                return 2;

            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min)(MaxExitCode, (std::max)(totals.error, static_cast<int>(totals.assertions.failed)));
        }